

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<JointPolicyValuePair>::shared_ptr<JPPVValuePair>
          (shared_ptr<JointPolicyValuePair> *this,JPPVValuePair *p)

{
  this->px = &p->super_JointPolicyValuePair;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::sp_pointer_construct<JointPolicyValuePair,JPPVValuePair>(this,p,&this->pn);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }